

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

int google::protobuf::GlobalReplaceSubstring(string *substring,string *replacement,string *s)

{
  LogMessage *other;
  long lVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  string tmp;
  undefined1 *local_88;
  ulong local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  LogMessage local_68;
  
  if (s == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x656);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: s != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  iVar4 = 0;
  if ((s->_M_string_length != 0) && (iVar4 = 0, substring->_M_string_length != 0)) {
    local_88 = &local_78;
    local_80 = 0;
    local_78 = 0;
    iVar4 = 0;
    lVar1 = std::__cxx11::string::find((char *)s,(ulong)(substring->_M_dataplus)._M_p,0);
    uVar2 = 0;
    if ((int)lVar1 != -1) {
      lVar3 = 0;
      iVar4 = 0;
      do {
        std::__cxx11::string::append((string *)&local_88,(ulong)s,(long)(int)lVar3);
        std::__cxx11::string::replace
                  ((ulong)&local_88,local_80,(char *)0x0,(ulong)(replacement->_M_dataplus)._M_p);
        lVar3 = lVar1 + substring->_M_string_length;
        lVar1 = std::__cxx11::string::find
                          ((char *)s,(ulong)(substring->_M_dataplus)._M_p,(long)(int)lVar3);
        iVar4 = iVar4 + 1;
      } while ((int)lVar1 != -1);
      uVar2 = (ulong)(int)lVar3;
    }
    if (iVar4 != 0) {
      std::__cxx11::string::append((string *)&local_88,(ulong)s,uVar2);
      std::__cxx11::string::swap((string *)s);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
  }
  return iVar4;
}

Assistant:

int GlobalReplaceSubstring(const string& substring,
                           const string& replacement,
                           string* s) {
  GOOGLE_CHECK(s != NULL);
  if (s->empty() || substring.empty())
    return 0;
  string tmp;
  int num_replacements = 0;
  int pos = 0;
  for (int match_pos = s->find(substring.data(), pos, substring.length());
       match_pos != string::npos;
       pos = match_pos + substring.length(),
           match_pos = s->find(substring.data(), pos, substring.length())) {
    ++num_replacements;
    // Append the original content before the match.
    tmp.append(*s, pos, match_pos - pos);
    // Append the replacement for the match.
    tmp.append(replacement.begin(), replacement.end());
  }
  // Append the content after the last match. If no replacements were made, the
  // original string is left untouched.
  if (num_replacements > 0) {
    tmp.append(*s, pos, s->length() - pos);
    s->swap(tmp);
  }
  return num_replacements;
}